

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# media.cpp
# Opt level: O3

HomogeneousMedium *
pbrt::HomogeneousMedium::Create(ParameterDictionary *parameters,FileLoc *loc,Allocator alloc)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  memory_resource *pmVar2;
  undefined1 auVar3 [16];
  bool bVar4;
  int iVar5;
  uint uVar6;
  float *__result;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  float *pfVar7;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  long lVar8;
  float *pfVar9;
  SpectrumHandle SVar10;
  PiecewiseLinearSpectrum *this;
  RGBSigmoidPolynomial *this_00;
  ParsedParameter *pPVar11;
  float fVar12;
  Float FVar13;
  undefined1 auVar14 [64];
  SpectrumHandle Le;
  string preset;
  string local_e0;
  float local_c0;
  Float local_bc;
  undefined1 local_b8 [24];
  undefined1 local_a0 [32];
  SpectrumHandle local_80;
  undefined1 local_78 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  _Alloc_hider local_48;
  RGBColorSpace *local_40;
  SpectrumHandle local_38;
  
  paVar1 = &local_e0.field_2;
  local_b8._8_8_ = (ParsedParameter *)0x0;
  local_80.
  super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
  .bits = (TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
           )0;
  local_e0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"preset","");
  local_a0._0_8_ = (ParsedParameter *)(local_a0 + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"");
  ParameterDictionary::GetOneString((string *)local_78,parameters,&local_e0,(string *)local_a0);
  if ((ParsedParameter *)local_a0._0_8_ != (ParsedParameter *)(local_a0 + 0x10)) {
    operator_delete((void *)local_a0._0_8_,
                    (ulong)((long)&(((string *)local_a0._16_8_)->_M_dataplus)._M_p + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != paVar1) {
    operator_delete(local_e0._M_dataplus._M_p,
                    CONCAT71(local_e0.field_2._M_allocated_capacity._1_7_,
                             local_e0.field_2._M_local_buf[0]) + 1);
  }
  if (((ParsedParameter *)local_78._8_8_ != (ParsedParameter *)0x0) &&
     (bVar4 = GetMediumScatteringProperties
                        ((string *)local_78,(SpectrumHandle *)(local_b8 + 8),&local_80,alloc),
     !bVar4)) {
    local_e0._M_string_length = 0;
    local_e0.field_2._M_local_buf[0] = '\0';
    local_e0._M_dataplus._M_p = (pointer)paVar1;
    detail::stringPrintfRecursive<std::__cxx11::string&>
              (&local_e0,"Material preset \"%s\" not found.",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78);
    Warning(loc,local_e0._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != paVar1) {
      operator_delete(local_e0._M_dataplus._M_p,
                      CONCAT71(local_e0.field_2._M_allocated_capacity._1_7_,
                               local_e0.field_2._M_local_buf[0]) + 1);
    }
  }
  pPVar11 = (ParsedParameter *)local_b8._8_8_;
  if ((ParsedParameter *)local_b8._8_8_ == (ParsedParameter *)0x0) {
    local_e0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"sigma_a","");
    local_40 = (RGBColorSpace *)0x0;
    ParameterDictionary::GetOneSpectrum
              ((ParameterDictionary *)local_a0,(string *)parameters,(SpectrumHandle *)&local_e0,
               (SpectrumType)&local_40,(Allocator)0x1);
    pPVar11 = (ParsedParameter *)local_a0._0_8_;
    local_b8._8_8_ = local_a0._0_8_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != paVar1) {
      operator_delete(local_e0._M_dataplus._M_p,
                      CONCAT71(local_e0.field_2._M_allocated_capacity._1_7_,
                               local_e0.field_2._M_local_buf[0]) + 1);
    }
    if (pPVar11 == (ParsedParameter *)0x0) {
      iVar5 = (*(alloc.memoryResource)->_vptr_memory_resource[2])(alloc.memoryResource,4,4);
      *(undefined4 *)CONCAT44(extraout_var,iVar5) = 0x3f800000;
      pPVar11 = (ParsedParameter *)(CONCAT44(extraout_var,iVar5) | 0x1000000000000);
    }
  }
  SVar10.
  super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
  .bits = (TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
           )(TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
             )local_80;
  if (local_80.
      super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
      .bits == 0) {
    local_e0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"sigma_s","");
    local_48._M_p = (pointer)0x0;
    ParameterDictionary::GetOneSpectrum
              ((ParameterDictionary *)local_a0,(string *)parameters,(SpectrumHandle *)&local_e0,
               (SpectrumType)&local_48,(Allocator)0x1);
    SVar10.
    super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
    .bits = (TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
             )(TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
               )local_a0._0_8_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != paVar1) {
      operator_delete(local_e0._M_dataplus._M_p,
                      CONCAT71(local_e0.field_2._M_allocated_capacity._1_7_,
                               local_e0.field_2._M_local_buf[0]) + 1);
    }
    if (SVar10.
        super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
        .bits == 0) {
      iVar5 = (*(alloc.memoryResource)->_vptr_memory_resource[2])(alloc.memoryResource,4,4);
      *(undefined4 *)CONCAT44(extraout_var_00,iVar5) = 0x3f800000;
      SVar10.
      super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
      .bits = (TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
               )(CONCAT44(extraout_var_00,iVar5) | 0x1000000000000);
    }
  }
  local_e0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"Le","");
  local_58._8_8_ = 0;
  ParameterDictionary::GetOneSpectrum
            ((ParameterDictionary *)local_b8,(string *)parameters,(SpectrumHandle *)&local_e0,
             (int)&local_58 + 8,(Allocator)0x2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != paVar1) {
    operator_delete(local_e0._M_dataplus._M_p,
                    CONCAT71(local_e0.field_2._M_allocated_capacity._1_7_,
                             local_e0.field_2._M_local_buf[0]) + 1);
  }
  local_e0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"Lescale","");
  local_bc = ParameterDictionary::GetOneFloat(parameters,&local_e0,1.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != paVar1) {
    operator_delete(local_e0._M_dataplus._M_p,
                    CONCAT71(local_e0.field_2._M_allocated_capacity._1_7_,
                             local_e0.field_2._M_local_buf[0]) + 1);
  }
  if ((ParsedParameter *)local_b8._0_8_ == (ParsedParameter *)0x0) {
LAB_0032527f:
    iVar5 = (*(alloc.memoryResource)->_vptr_memory_resource[2])(alloc.memoryResource,4,4);
    *(undefined4 *)CONCAT44(extraout_var_01,iVar5) = 0;
    local_b8._0_8_ = CONCAT44(extraout_var_01,iVar5) | 0x1000000000000;
  }
  else {
    if ((ulong)local_b8._0_8_ >> 0x32 == 0) {
      this = (PiecewiseLinearSpectrum *)(local_b8._0_8_ & 0xffffffffffff);
      if ((ulong)local_b8._0_8_ >> 0x31 == 0) {
        fVar12 = *(float *)&(this->lambdas).alloc.memoryResource;
      }
      else if (SUB82(local_b8._0_8_,6) == 2) {
        pfVar7 = (float *)(this->lambdas).nAlloc;
        pmVar2 = (this->values).alloc.memoryResource;
        if ((memory_resource *)0x1 < pmVar2) {
          auVar14 = ZEXT464((uint)*pfVar7);
          lVar8 = (long)pmVar2 * 4 + -4;
          pfVar9 = pfVar7;
          do {
            pfVar9 = pfVar9 + 1;
            fVar12 = auVar14._0_4_;
            auVar3 = vmaxss_avx(ZEXT416((uint)*pfVar9),auVar14._0_16_);
            auVar14 = ZEXT1664(auVar3);
            if (fVar12 < *pfVar9) {
              pfVar7 = pfVar9;
            }
            lVar8 = lVar8 + -4;
          } while (lVar8 != 0);
        }
        fVar12 = *pfVar7;
      }
      else {
        fVar12 = PiecewiseLinearSpectrum::MaxValue(this);
      }
LAB_00325273:
      if ((fVar12 == 0.0) && (!NAN(fVar12))) goto LAB_0032527f;
    }
    else {
      uVar6 = SUB82(local_b8._0_8_,6) - 3;
      if (uVar6 < 3) {
        this_00 = (RGBSigmoidPolynomial *)(local_b8._0_8_ & 0xffffffffffff);
        if (uVar6 == 2) {
          local_c0 = this_00->c0;
          FVar13 = RGBSigmoidPolynomial::MaxValue((RGBSigmoidPolynomial *)&this_00->c1);
          fVar12 = FVar13 * local_c0;
        }
        else {
          fVar12 = RGBSigmoidPolynomial::MaxValue(this_00);
        }
        goto LAB_00325273;
      }
      if ((uVar6 & 0x7ffffffe) == 2) {
        fVar12 = RGBIlluminantSpectrum::MaxValue
                           ((RGBIlluminantSpectrum *)(local_b8._0_8_ & 0xffffffffffff));
        goto LAB_00325273;
      }
    }
    local_58._M_allocated_capacity = local_b8._0_8_;
    FVar13 = SpectrumToPhotometric((SpectrumHandle *)&local_58._M_allocated_capacity);
    local_bc = local_bc / FVar13;
  }
  local_e0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"scale","");
  local_c0 = ParameterDictionary::GetOneFloat(parameters,&local_e0,1.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != paVar1) {
    operator_delete(local_e0._M_dataplus._M_p,
                    CONCAT71(local_e0.field_2._M_allocated_capacity._1_7_,
                             local_e0.field_2._M_local_buf[0]) + 1);
  }
  local_e0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"g","");
  local_b8._20_4_ = ParameterDictionary::GetOneFloat(parameters,&local_e0,0.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != paVar1) {
    operator_delete(local_e0._M_dataplus._M_p,
                    CONCAT71(local_e0.field_2._M_allocated_capacity._1_7_,
                             local_e0.field_2._M_local_buf[0]) + 1);
  }
  iVar5 = (*(alloc.memoryResource)->_vptr_memory_resource[2])(alloc.memoryResource,0x88,8);
  local_38.
  super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
  .bits = (TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
           )(TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
             )local_b8._0_8_;
  local_e0._M_dataplus._M_p = (pointer)pPVar11;
  local_a0._0_8_ =
       SVar10.
       super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
       .bits;
  HomogeneousMedium((HomogeneousMedium *)CONCAT44(extraout_var_02,iVar5),(SpectrumHandle *)&local_e0
                    ,(SpectrumHandle *)local_a0,local_c0,&local_38,local_bc,(Float)local_b8._20_4_,
                    alloc);
  if ((ParsedParameter *)local_78._0_8_ != (ParsedParameter *)(local_78 + 0x10)) {
    operator_delete((void *)local_78._0_8_,local_78._16_8_ + 1);
  }
  return (HomogeneousMedium *)CONCAT44(extraout_var_02,iVar5);
}

Assistant:

HomogeneousMedium *HomogeneousMedium::Create(const ParameterDictionary &parameters,
                                             const FileLoc *loc, Allocator alloc) {
    SpectrumHandle sig_a = nullptr, sig_s = nullptr;
    std::string preset = parameters.GetOneString("preset", "");
    if (!preset.empty()) {
        if (!GetMediumScatteringProperties(preset, &sig_a, &sig_s, alloc))
            Warning(loc, "Material preset \"%s\" not found.", preset);
    }
    if (sig_a == nullptr) {
        sig_a =
            parameters.GetOneSpectrum("sigma_a", nullptr, SpectrumType::Unbounded, alloc);
        if (sig_a == nullptr)
            sig_a = alloc.new_object<ConstantSpectrum>(1.f);
    }
    if (sig_s == nullptr) {
        sig_s =
            parameters.GetOneSpectrum("sigma_s", nullptr, SpectrumType::Unbounded, alloc);
        if (sig_s == nullptr)
            sig_s = alloc.new_object<ConstantSpectrum>(1.f);
    }

    SpectrumHandle Le =
        parameters.GetOneSpectrum("Le", nullptr, SpectrumType::Illuminant, alloc);
    Float LeScale = parameters.GetOneFloat("Lescale", 1.f);
    if (Le == nullptr || Le.MaxValue() == 0)
        Le = alloc.new_object<ConstantSpectrum>(0.f);
    else
        LeScale /= SpectrumToPhotometric(Le);

    Float sigScale = parameters.GetOneFloat("scale", 1.f);
    Float g = parameters.GetOneFloat("g", 0.0f);

    return alloc.new_object<HomogeneousMedium>(sig_a, sig_s, sigScale, Le, LeScale, g,
                                               alloc);
}